

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

void __thiscall
Js::AsmJsModuleCompiler::AccumulateCompileTime(AsmJsModuleCompiler *this,Phases phase)

{
  Tick TVar1;
  Tick local_28;
  AsmJsCompileTime curTime;
  TickDelta td;
  Phases phase_local;
  AsmJsModuleCompiler *this_local;
  
  TickDelta::TickDelta((TickDelta *)&curTime);
  local_28.m_luTick = (uint64)GetTick(this);
  curTime.m_luTick = (uint64)Tick::operator-(&local_28,(this->mCompileTimeLastTick).m_luTick);
  TVar1 = Tick::operator+(&this->mCompileTime,(TickDelta)curTime.m_luTick);
  (this->mCompileTime).m_luTick = TVar1.m_luTick;
  (this->mCompileTimeLastTick).m_luTick = local_28.m_luTick;
  TVar1 = Tick::operator+((Tick *)(&this->mAsmArrayBuiltinUsedBV + (ulong)phase + 1),
                          curTime.m_luTick);
  (&this->mAsmArrayBuiltinUsedBV)[(ulong)phase + 1].data[0].word = TVar1.m_luTick;
  return;
}

Assistant:

void AsmJsModuleCompiler::AccumulateCompileTime(AsmJsCompilation::Phases phase)
    {
        Js::TickDelta td;
        AsmJsCompileTime curTime = GetTick();
        td = curTime - mCompileTimeLastTick;
        mCompileTime = mCompileTime + td;
        mCompileTimeLastTick = curTime;
        mPhaseCompileTime[phase] = mPhaseCompileTime[phase] + td;
    }